

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecompiler.cpp
# Opt level: O3

bool __thiscall asmjit::CodeCompiler::getSaveOnUnuse(CodeCompiler *this,Reg *reg)

{
  uint uVar1;
  long lVar2;
  undefined1 extraout_AL;
  int iVar3;
  undefined1 *puVar4;
  undefined4 extraout_var;
  char extraout_DL;
  char *__format;
  undefined8 uStack_138;
  undefined1 *puStack_130;
  undefined1 *puStack_128;
  undefined1 auStack_118 [176];
  char acStack_68 [63];
  undefined1 uStack_29;
  undefined1 auStack_8 [8];
  
  uVar1 = (reg->super_Operand).super_Operand_.field_0._any.id;
  if (uVar1 < 0x100) {
    return false;
  }
  if (uVar1 == 0xffffffff) {
    getSaveOnUnuse();
  }
  else if ((ulong)(uVar1 - 0x100) < (this->_vRegArray).super_ZoneVectorBase._length) {
    return (bool)((*(byte *)(*(long *)((long)(this->_vRegArray).super_ZoneVectorBase._data +
                                      (ulong)(uVar1 - 0x100) * 8) + 0x17) & 8) >> 3);
  }
  getSaveOnUnuse();
  uVar1 = (reg->super_Operand).super_Operand_.field_0._any.id;
  if (uVar1 < 0x100) {
    return (bool)extraout_AL;
  }
  if (uVar1 == 0xffffffff) {
    setSaveOnUnuse();
  }
  else if ((ulong)(uVar1 - 0x100) < (this->_vRegArray).super_ZoneVectorBase._length) {
    lVar2 = *(long *)((long)(this->_vRegArray).super_ZoneVectorBase._data +
                     (ulong)(uVar1 - 0x100) * 8);
    if (lVar2 == 0) {
      return (bool)extraout_AL;
    }
    *(byte *)(lVar2 + 0x17) = *(byte *)(lVar2 + 0x17) & 0xf7 | extraout_DL << 3;
    return (bool)extraout_AL;
  }
  setSaveOnUnuse();
  uVar1 = (reg->super_Operand).super_Operand_.field_0._any.id;
  puVar4 = (undefined1 *)(ulong)uVar1;
  if (uVar1 < 0x100) {
LAB_00113f38:
    return SUB81(puVar4,0);
  }
  if (uVar1 == 0xffffffff) {
    rename((char *)this,(char *)reg);
  }
  else {
    puVar4 = (undefined1 *)(ulong)(uVar1 - 0x100);
    if (puVar4 < (undefined1 *)(this->_vRegArray).super_ZoneVectorBase._length) {
      lVar2 = *(long *)((long)(this->_vRegArray).super_ZoneVectorBase._data + (long)puVar4 * 8);
      if (lVar2 != 0) {
        puVar4 = &noName;
        *(undefined1 **)(lVar2 + 8) = &noName;
        if ((__format != (char *)0x0) && (*__format != '\0')) {
          puStack_128 = auStack_118;
          puStack_130 = auStack_8;
          uStack_138 = 0x3000000018;
          vsnprintf(acStack_68,0x40,__format,&uStack_138);
          uStack_29 = 0;
          strlen(acStack_68);
          iVar3 = Zone::dup(&(this->super_CodeBuilder)._cbDataZone,(int)acStack_68);
          puVar4 = (undefined1 *)CONCAT44(extraout_var,iVar3);
          *(undefined1 **)(lVar2 + 8) = puVar4;
        }
      }
      goto LAB_00113f38;
    }
  }
  rename((char *)this,(char *)reg);
  __cxa_begin_catch();
  std::terminate();
}

Assistant:

bool CodeCompiler::getSaveOnUnuse(Reg& reg) const {
  if (!reg.isVirtReg()) return false;

  VirtReg* vreg = getVirtRegById(reg.getId());
  return static_cast<bool>(vreg->_saveOnUnuse);
}